

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall fmt::v11::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  int *piVar1;
  size_t sVar2;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  
  if (other->exp_ < this->exp_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format.h"
                ,0x9ed,"unaligned bigints");
  }
  iVar5 = compare(this,other);
  if (-1 < iVar5) {
    sVar2 = (other->bigits_).super_buffer<unsigned_int>.size_;
    if (sVar2 != 0) {
      puVar3 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
      lVar6 = (long)(other->exp_ - this->exp_);
      puVar4 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      lVar7 = lVar6 << 0x20;
      sVar8 = 0;
      lVar9 = 0;
      do {
        lVar7 = lVar7 + 0x100000000;
        lVar10 = (ulong)puVar4[lVar6 + sVar8] + (lVar9 - (ulong)puVar3[sVar8]);
        puVar4[lVar6 + sVar8] = (uint)lVar10;
        lVar9 = lVar10 >> 0x3f;
        sVar8 = sVar8 + 1;
      } while (sVar2 != sVar8);
      if (lVar10 < 0) {
        piVar1 = (int *)((long)(this->bigits_).super_buffer<unsigned_int>.ptr_ + (lVar7 >> 0x1e));
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        if (iVar5 == 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format.h"
                      ,0x9f4,"");
        }
      }
    }
    remove_leading_zeros(this);
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format.h"
              ,0x9ee,"");
}

Assistant:

FMT_CONSTEXPR void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    if (borrow != 0) subtract_bigits(i, 0, borrow);
    FMT_ASSERT(borrow == 0, "");
    remove_leading_zeros();
  }